

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov.cpp
# Opt level: O1

void EBGodunov::ComputeAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,
               int edge_comp,bool known_edgestate,MultiFab *xfluxes,MultiFab *yfluxes,
               MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,MultiFab *divu,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bc,BCRec *d_bc,Geometry *geom,
               Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity,
               string redistribution_type)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  Box *pBVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer piVar7;
  FabFactory<amrex::FArrayBox> *pFVar8;
  EBCellFlagFab *pEVar9;
  Geometry geom_00;
  string redistribution_type_00;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  FabType FVar15;
  FabType FVar16;
  int iVar17;
  long lVar18;
  EBFArrayBoxFactory *pEVar19;
  FabArray<amrex::EBCellFlagFab> *pFVar20;
  MultiCutFab *pMVar21;
  FabArray<amrex::FArrayBox> *this;
  Array4<const_double> *pAVar22;
  FabArray<amrex::EBCellFlagFab> *pFVar23;
  Arena *pAVar24;
  int iVar25;
  int *piVar26;
  ulong uVar27;
  size_t __n;
  long lVar28;
  long lVar29;
  int i_1;
  double **ppdVar30;
  size_type a_capacity;
  long lVar31;
  Geometry *pGVar32;
  long lVar33;
  undefined8 *puVar34;
  long lVar35;
  Array4<const_double> *pAVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  uint32_t *puVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  bool bVar46;
  byte bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  Periodicity PVar56;
  undefined1 in_stack_fffffffffffff1f0 [64];
  undefined8 in_stack_fffffffffffff230;
  Array4<const_double> *in_stack_fffffffffffff238;
  Array4<const_double> *in_stack_fffffffffffff240;
  Array4<const_double> *in_stack_fffffffffffff248;
  Array4<const_double> *in_stack_fffffffffffff250;
  Array4<const_double> *in_stack_fffffffffffff258;
  Geometry *in_stack_fffffffffffff260;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff268;
  BCRec *in_stack_fffffffffffff270;
  int *in_stack_fffffffffffff278;
  undefined8 in_stack_fffffffffffff280;
  Array4<const_double> *in_stack_fffffffffffff288;
  Array4<double> *in_stack_fffffffffffff290;
  Array4<const_double> *in_stack_fffffffffffff298;
  Array4<const_double> *in_stack_fffffffffffff2a0;
  Array4<const_double> *in_stack_fffffffffffff2a8;
  Array4<const_double> *in_stack_fffffffffffff2b0;
  undefined8 in_stack_fffffffffffff2e8;
  Array4<const_double> *in_stack_fffffffffffff2f0;
  Array4<const_double> *in_stack_fffffffffffff2f8;
  long local_d00;
  long local_cf8;
  uint32_t *local_ce8;
  long local_ce0;
  long local_cd0;
  Array4<const_double> *local_cc0;
  Array4<const_double> *local_cb8;
  Box local_c9c;
  double *local_c80;
  ulong local_c78;
  long local_c70;
  int *local_c68;
  int local_c5c;
  Box result;
  int local_c3c;
  Dim3 local_c38;
  ulong local_c2c;
  int local_c24;
  double *local_bf8;
  double *local_bf0;
  double *local_be8;
  double *local_b90;
  double *local_b50;
  double *local_b48;
  double *local_b40;
  Array4<const_double> local_b20;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<double> local_a20;
  Real local_9e0;
  EBFArrayBoxFactory *local_9d8;
  long local_9d0;
  double *local_9c8;
  long local_9c0;
  double *local_9b8;
  double *local_9b0;
  long local_9a8;
  long local_9a0;
  long local_998;
  long local_990;
  long local_988;
  long local_980;
  long local_978;
  long local_970;
  Array4<const_amrex::EBCellFlag> local_968;
  int local_924;
  int local_920;
  int local_91c;
  Array<const_MultiFab_*,_3> u;
  int local_8f8 [8];
  Vector<int,_std::allocator<int>_> *local_8d8;
  Array4<double> local_8b8;
  undefined1 local_878 [32];
  int local_858;
  int local_854;
  int local_850;
  Box result_1;
  int local_818;
  int iStack_814;
  DeviceVector<int> iconserv_d;
  Array4<const_double> local_7c8;
  Array4<double> advc_arr;
  undefined1 local_6a8 [32];
  Dim3 local_688;
  undefined1 local_67c [16];
  long *local_668 [2];
  long local_658 [2];
  Array4<const_double> local_648;
  Array4<const_double> local_608;
  Array4<const_double> local_5c0;
  Elixir eli_1;
  int local_560;
  int local_55c;
  int local_558;
  MultiCutFab *local_540;
  MultiCutFab *local_538;
  MultiCutFab *local_530;
  MultiCutFab *local_528;
  MultiCutFab *local_520;
  MultiCutFab *local_518;
  Array4<const_double> local_510;
  Array4<const_double> local_4d0;
  Elixir eli;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  Dim3 local_398;
  undefined1 local_38c [16];
  Array4<const_amrex::EBCellFlag> local_378;
  MultiFab divu_mac;
  MultiFab advc;
  
  bVar47 = 0;
  uVar42 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 2;
  iconserv_d.m_data = (pointer)0x0;
  iconserv_d.m_size = 0;
  iconserv_d.m_capacity = 0;
  a_capacity = 0x10;
  if (0x10 < uVar42) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar42);
  }
  local_c5c = state_comp;
  local_9e0 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::AllocateBuffer(&iconserv_d,a_capacity);
  iconserv_d.m_size = uVar42;
  piVar7 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar7;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar7,__n);
  }
  local_c68 = iconserv_d.m_data;
  pFVar8 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar8 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar18 = __dynamic_cast(pFVar8,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                              &amrex::EBFArrayBoxFactory::typeinfo), lVar18 == 0)) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBGodunov/hydro_ebgodunov.cpp"
                       ,0x34,(char *)0x0);
  }
  pEVar19 = (EBFArrayBoxFactory *)
            __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar19 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  pFVar20 = amrex::EBDataCollection::getMultiEBCellFlagFab
                      ((pEVar19->m_ebdc).
                       super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  amrex::EBDataCollection::getFaceCent
            ((pEVar19->m_ebdc).
             super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pMVar21 = amrex::EBDataCollection::getCentroid
                      ((pEVar19->m_ebdc).
                       super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  this = &amrex::EBDataCollection::getVolFrac
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->super_FabArray<amrex::FArrayBox>;
  amrex::EBDataCollection::getAreaFrac
            ((pEVar19->m_ebdc).
             super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bxs = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ = 0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 1;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  amrex::MultiFab::MultiFab
            (&advc,bxs,dm,ncomp,3,(MFInfo *)&divu_mac,(FabFactory<amrex::FArrayBox> *)pEVar19);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0,0,
             advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  u._M_elems[0]._1_7_ = 0;
  u._M_elems[0]._0_1_ = 1;
  u._M_elems[1]._0_4_ = 0;
  u._M_elems[1]._4_4_ = 0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_8f8[0] = 0;
  local_8f8[1] = 0;
  amrex::MultiFab::MultiFab
            (&divu_mac,bxs,dm,1,0,(MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)pEVar19);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar7 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar7 >> 2;
  u._M_elems[1] = (MultiFab *)CONCAT44(u._M_elems[1]._4_4_,(int)u._M_elems[1]);
  if (0 < lVar18) {
    lVar28 = 0;
    do {
      if (piVar7[lVar28] == 0) {
        u._M_elems[0]._0_1_ = SUB81(umac,0);
        u._M_elems[0]._1_7_ = (undefined7)((ulong)umac >> 8);
        u._M_elems[2] = wmac;
        u._M_elems[1] = vmac;
        bVar46 = amrex::EBFArrayBoxFactory::isAllRegular(pEVar19);
        if (bVar46) {
          amrex::computeDivergence(&divu_mac,&u,geom);
        }
        else {
          amrex::EB_computeDivergence(&divu_mac,&u,geom,true);
        }
        break;
      }
      lVar28 = lVar28 + 1;
      u._M_elems[1] = (MultiFab *)CONCAT44(u._M_elems[1]._4_4_,(int)u._M_elems[1]);
    } while (lVar18 != lVar28);
  }
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  local_9d8 = pEVar19;
  if (local_8f8[0] < local_8f8[2]) {
    local_924 = ncomp * 0xe;
    pAVar22 = (Array4<const_double> *)(ulong)(uint)ncomp;
    do {
      pEVar19 = local_9d8;
      amrex::MFIter::tilebox(&local_c9c,(MFIter *)&u);
      pFVar23 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((pEVar19->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      piVar26 = local_8f8;
      if (local_8d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar26 = (local_8d8->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_8f8[0];
      }
      pEVar9 = (pFVar23->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar26];
      result.btype.itype = local_c9c.btype.itype;
      result.smallend.vect[2] = local_c9c.smallend.vect[2] - 3;
      result.bigend.vect[0] = local_c9c.bigend.vect[0] + 3;
      result.smallend.vect[1] = local_c9c.smallend.vect[1] - 3;
      result.smallend.vect[0] = local_c9c.smallend.vect[0] + -3;
      result.bigend.vect[1] = local_c9c.bigend.vect[1] + 3;
      result.bigend.vect[2] = local_c9c.bigend.vect[2] + 3;
      FVar15 = amrex::EBCellFlagFab::getType(pEVar9,&result);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_968,&xfluxes->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_a20,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_8b8,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apx,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apy,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apz,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcx,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcy,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcz,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      FVar16 = amrex::EBCellFlagFab::getType(pEVar9,&local_c9c);
      if (FVar16 == covered) {
        amrex::MFIter::nodaltilebox((Box *)&local_7c8,(MFIter *)&u,0);
        amrex::MFIter::nodaltilebox((Box *)&local_b20,(MFIter *)&u,1);
        amrex::MFIter::nodaltilebox((Box *)&local_4d0,(MFIter *)&u,2);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                   aofs_comp);
        auVar12 = _DAT_0077bb40;
        auVar11 = _DAT_0077bb30;
        local_c70 = local_968.kstride;
        local_c80 = (double *)(long)apy.begin.y;
        if (0 < ncomp) {
          in_stack_fffffffffffff2f8 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff2f8 >> 0x20),local_c9c.bigend.vect[2]);
          uVar44 = local_c9c.bigend.vect[0] - local_c9c.smallend.vect[0];
          auVar52._4_4_ = 0;
          auVar52._0_4_ = uVar44;
          auVar52._8_4_ = uVar44;
          auVar52._12_4_ = 0;
          in_stack_fffffffffffff2f0 =
               (Array4<const_double> *)
               (result.smallend.vect._0_8_ +
                ((long)local_c9c.smallend.vect[1] - (long)local_c38.y) *
                CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                (long)local_c9c.smallend.vect[0] * 8 + (long)local_c38.x * -8 + 8);
          local_c78 = CONCAT44(local_c3c,result.btype.itype) * 8;
          auVar52 = auVar52 ^ _DAT_0077bb40;
          pAVar36 = (Array4<const_double> *)0x0;
          do {
            uVar39 = local_c9c.smallend.vect[2];
            if (local_c9c.smallend.vect[2] <= local_c9c.bigend.vect[2]) {
              do {
                if (local_c9c.smallend.vect[1] <= local_c9c.bigend.vect[1]) {
                  ppdVar30 = (double **)
                             ((long)&in_stack_fffffffffffff2f0->p +
                             ((long)(int)uVar39 - (long)local_c38.z) *
                             CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8);
                  lVar18 = (long)local_c9c.smallend.vect[1];
                  do {
                    if (local_c9c.smallend.vect[0] <= local_c9c.bigend.vect[0]) {
                      uVar42 = 0;
                      do {
                        auVar50._8_4_ = (int)uVar42;
                        auVar50._0_8_ = uVar42;
                        auVar50._12_4_ = (int)(uVar42 >> 0x20);
                        auVar50 = (auVar50 | auVar11) ^ auVar12;
                        bVar46 = auVar52._0_4_ < auVar50._0_4_;
                        iVar17 = auVar52._4_4_;
                        iVar55 = auVar50._4_4_;
                        if ((bool)(~(iVar17 < iVar55 || iVar55 == iVar17 && bVar46) & 1)) {
                          ppdVar30[uVar42 - 1] = (double *)0x483d6329f1c35ca5;
                        }
                        if (iVar17 >= iVar55 && (iVar55 != iVar17 || !bVar46)) {
                          ppdVar30[uVar42] = (double *)0x483d6329f1c35ca5;
                        }
                        uVar42 = uVar42 + 2;
                      } while (((ulong)uVar44 + 2 & 0x1fffffffe) != uVar42);
                    }
                    lVar18 = lVar18 + 1;
                    ppdVar30 = ppdVar30 + CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
                  } while (local_c9c.bigend.vect[1] + 1U != (int)lVar18);
                }
                bVar46 = uVar39 != local_c9c.bigend.vect[2];
                uVar39 = uVar39 + 1;
              } while (bVar46);
            }
            pAVar36 = (Array4<const_double> *)((long)&pAVar36->p + 1);
            in_stack_fffffffffffff2f0 =
                 (Array4<const_double> *)
                 (&in_stack_fffffffffffff2f0->p + CONCAT44(local_c3c,result.btype.itype));
          } while (pAVar36 != pAVar22);
        }
        if (0 < ncomp) {
          in_stack_fffffffffffff2f8 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff2f8 >> 0x20),local_7c8.kstride._4_4_);
          lVar18 = (long)local_7c8.p._4_4_;
          local_cd0 = (long)apx.p +
                      (lVar18 - apx.begin.y) * apx.jstride * 8 + (long)(int)local_7c8.p * 8 +
                      (long)apx.begin.x * -8;
          local_ce8 = (uint32_t *)
                      ((long)&local_968.p[(long)local_968.begin.x * -2 + (long)(int)local_7c8.p * 2]
                              .flag + (lVar18 - local_968.begin.y) * local_968.jstride * 8);
          local_c70 = local_968.kstride * 8;
          pAVar36 = (Array4<const_double> *)0x0;
          do {
            in_stack_fffffffffffff2f0 = pAVar36;
            iVar17 = (int)local_7c8.jstride;
            if ((int)local_7c8.jstride <= local_7c8.kstride._4_4_) {
              do {
                if (local_7c8.p._4_4_ <= (int)local_7c8.kstride) {
                  lVar40 = ((long)iVar17 - (long)apx.begin.z) * apx.kstride * 8 + local_cd0;
                  puVar41 = (uint32_t *)
                            (((long)iVar17 - (long)local_968.begin.z) * local_c70 + (long)local_ce8)
                  ;
                  lVar28 = lVar18;
                  do {
                    if ((int)local_7c8.p <= local_7c8.jstride._4_4_) {
                      lVar29 = 0;
                      do {
                        *(undefined8 *)(puVar41 + lVar29 * 2) = 0;
                        *(undefined8 *)(lVar40 + lVar29 * 8) = 0x483d6329f1c35ca5;
                        lVar29 = lVar29 + 1;
                      } while ((local_7c8.jstride._4_4_ - (int)local_7c8.p) + 1 != (int)lVar29);
                    }
                    lVar28 = lVar28 + 1;
                    lVar40 = lVar40 + apx.jstride * 8;
                    puVar41 = puVar41 + local_968.jstride * 2;
                  } while ((int)local_7c8.kstride + 1 != (int)lVar28);
                }
                bVar46 = iVar17 != local_7c8.kstride._4_4_;
                iVar17 = iVar17 + 1;
              } while (bVar46);
            }
            pAVar36 = (Array4<const_double> *)((long)&in_stack_fffffffffffff2f0->p + 1);
            local_cd0 = local_cd0 + apx.nstride * 8;
            local_ce8 = local_ce8 + local_968.nstride * 2;
          } while (pAVar36 != pAVar22);
        }
        if (0 < ncomp) {
          lVar18 = (long)local_b20.p._4_4_;
          local_ce0 = (long)apy.p +
                      (lVar18 - (long)local_c80) * apy.jstride * 8 + (long)(int)local_b20.p * 8 +
                      (long)apy.begin.x * -8;
          local_cf8 = (long)local_a20.p +
                      (lVar18 - local_a20.begin.y) * local_a20.jstride * 8 +
                      (long)(int)local_b20.p * 8 + (long)local_a20.begin.x * -8;
          pAVar36 = (Array4<const_double> *)0x0;
          do {
            in_stack_fffffffffffff2f8 = pAVar36;
            iVar17 = (int)local_b20.jstride;
            if ((int)local_b20.jstride <= local_b20.kstride._4_4_) {
              do {
                if (local_b20.p._4_4_ <= (int)local_b20.kstride) {
                  lVar29 = ((long)iVar17 - (long)apy.begin.z) * apy.kstride * 8 + local_ce0;
                  lVar40 = ((long)iVar17 - (long)local_a20.begin.z) * local_a20.kstride * 8 +
                           local_cf8;
                  lVar28 = lVar18;
                  do {
                    if ((int)local_b20.p <= local_b20.jstride._4_4_) {
                      lVar37 = 0;
                      do {
                        *(undefined8 *)(lVar40 + lVar37 * 8) = 0;
                        *(undefined8 *)(lVar29 + lVar37 * 8) = 0x483d6329f1c35ca5;
                        lVar37 = lVar37 + 1;
                      } while ((local_b20.jstride._4_4_ - (int)local_b20.p) + 1 != (int)lVar37);
                    }
                    lVar28 = lVar28 + 1;
                    lVar29 = lVar29 + apy.jstride * 8;
                    lVar40 = lVar40 + local_a20.jstride * 8;
                  } while ((int)local_b20.kstride + 1 != (int)lVar28);
                }
                bVar46 = iVar17 != local_b20.kstride._4_4_;
                iVar17 = iVar17 + 1;
              } while (bVar46);
            }
            pAVar36 = (Array4<const_double> *)((long)&in_stack_fffffffffffff2f8->p + 1);
            local_ce0 = local_ce0 + apy.nstride * 8;
            local_cf8 = local_cf8 + local_a20.nstride * 8;
          } while (pAVar36 != pAVar22);
        }
        if (0 < ncomp) {
          lVar18 = (long)local_4d0.p._4_4_;
          in_stack_fffffffffffff2f8 =
               (Array4<const_double> *)
               ((lVar18 - apz.begin.y) * apz.jstride * 8 + (long)(int)local_4d0.p * 8 +
                (long)apz.begin.x * -8 + (long)apz.p);
          local_d00 = (lVar18 - local_8b8.begin.y) * local_8b8.jstride * 8 +
                      (long)(int)local_4d0.p * 8 + (long)local_8b8.begin.x * -8 + (long)local_8b8.p;
          in_stack_fffffffffffff2f0 = (Array4<const_double> *)(local_8b8.kstride * 8);
          pAVar36 = (Array4<const_double> *)0x0;
          do {
            iVar17 = (int)local_4d0.jstride;
            if ((int)local_4d0.jstride <= local_4d0.kstride._4_4_) {
              do {
                if (local_4d0.p._4_4_ <= (int)local_4d0.kstride) {
                  ppdVar30 = (double **)
                             ((long)&in_stack_fffffffffffff2f8->p +
                             ((long)iVar17 - (long)apz.begin.z) * apz.kstride * 8);
                  lVar40 = ((long)iVar17 - (long)local_8b8.begin.z) *
                           (long)in_stack_fffffffffffff2f0 + local_d00;
                  lVar28 = lVar18;
                  do {
                    if ((int)local_4d0.p <= local_4d0.jstride._4_4_) {
                      lVar29 = 0;
                      do {
                        *(undefined8 *)(lVar40 + lVar29 * 8) = 0;
                        ppdVar30[lVar29] = (double *)0x483d6329f1c35ca5;
                        lVar29 = lVar29 + 1;
                      } while ((local_4d0.jstride._4_4_ - (int)local_4d0.p) + 1 != (int)lVar29);
                    }
                    lVar28 = lVar28 + 1;
                    ppdVar30 = ppdVar30 + apz.jstride;
                    lVar40 = lVar40 + local_8b8.jstride * 8;
                  } while ((int)local_4d0.kstride + 1 != (int)lVar28);
                }
                bVar46 = iVar17 != local_4d0.kstride._4_4_;
                iVar17 = iVar17 + 1;
              } while (bVar46);
            }
            pAVar36 = (Array4<const_double> *)((long)&pAVar36->p + 1);
            in_stack_fffffffffffff2f8 =
                 (Array4<const_double> *)(&in_stack_fffffffffffff2f8->p + apz.nstride);
            local_d00 = local_d00 + local_8b8.nstride * 8;
          } while (pAVar36 != pAVar22);
        }
      }
      else if (FVar15 == regular) {
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u,local_c5c);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_7c8,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_b20,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
          pGVar32 = geom;
          puVar34 = (undefined8 *)&stack0xfffffffffffff1f0;
          for (lVar18 = 0x19; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar34 = *(undefined8 *)&pGVar32->super_CoordSys;
            pGVar32 = (Geometry *)((long)pGVar32 + (ulong)bVar47 * -0x10 + 8);
            puVar34 = puVar34 + (ulong)bVar47 * -2 + 1;
          }
          geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff230;
          geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff1f0._0_4_;
          geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff1f0._4_4_;
          geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff1f0._8_8_;
          geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff1f0._16_8_;
          geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff1f0._24_8_;
          geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff1f0._32_8_;
          geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff1f0._40_8_;
          geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff1f0._48_8_;
          geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff1f0._56_8_;
          geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff238;
          geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff240;
          geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff248;
          geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff250;
          geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff258;
          geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff260;
          geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff268;
          geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff270;
          geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff278;
          geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff280;
          geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff288;
          geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff290;
          geom_00._168_8_ = in_stack_fffffffffffff298;
          geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff2a0;
          geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff2a8;
          geom_00.domain._20_8_ = in_stack_fffffffffffff2b0;
          Godunov::ComputeEdgeState
                    (&local_c9c,ncomp,(Array4<const_double> *)&result,(Array4<double> *)&apx,
                     (Array4<double> *)&apy,(Array4<double> *)&apz,&fcx,&fcy,&fcz,&local_7c8,
                     &local_b20,geom_00,local_9e0,d_bc,local_c68,false,false,is_velocity);
        }
        result.smallend.vect._0_8_ = apx.p;
        result.smallend.vect[2] = (int)apx.jstride;
        result.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
        result.bigend.vect[1] = (int)apx.kstride;
        result.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
        result.btype.itype = (uint)apx.nstride;
        local_7c8.p = apy.p;
        local_7c8.jstride = apy.jstride;
        local_7c8.kstride = apy.kstride;
        local_7c8.nstride = apy.nstride;
        local_7c8.begin.z = apy.begin.z;
        local_7c8.end.z = apy.end.z;
        local_7c8.end.x = apy.end.x;
        local_7c8.end.y = apy.end.y;
        local_7c8.ncomp = apy.ncomp;
        local_b20.p = apz.p;
        local_b20.jstride = apz.jstride;
        local_b20.kstride = apz.kstride;
        local_b20.nstride = apz.nstride;
        local_b20.begin.z = apz.begin.z;
        local_b20.end.z = apz.end.z;
        local_b20.end.x = apz.end.x;
        local_b20.end.y = apz.end.y;
        local_b20.ncomp = apz.ncomp;
        in_stack_fffffffffffff2a8 = &fcz;
        in_stack_fffffffffffff2a0 = (Array4<const_double> *)0x3ea819;
        in_stack_fffffffffffff2b0 = (Array4<const_double> *)&result;
        HydroUtils::ComputeFluxes
                  (&local_c9c,(Array4<double> *)&local_968,&local_a20,&local_8b8,&fcx,&fcy,
                   in_stack_fffffffffffff2a8,(Array4<const_double> *)&result,&local_7c8,&local_b20,
                   geom,ncomp,true);
        iVar17 = local_968.begin.z;
        uVar14 = local_968.begin._0_8_;
        result.smallend.vect._0_8_ = local_968.p;
        result.smallend.vect[2] = (int)local_968.jstride;
        result.bigend.vect[0] = (int)((ulong)local_968.jstride >> 0x20);
        result.bigend.vect[1] = (int)local_968.kstride;
        result.bigend.vect[2] = (int)((ulong)local_968.kstride >> 0x20);
        result.btype.itype = (uint)local_968.nstride;
        local_c3c = (int)((ulong)local_968.nstride >> 0x20);
        local_c38.z = local_968.begin.z;
        local_c38.x = local_968.begin.x;
        local_c38.y = local_968.begin.y;
        uVar13 = local_c38._0_8_;
        local_c24 = local_968.end.z;
        local_c2c._0_4_ = local_968.end.x;
        local_c2c._4_4_ = local_968.end.y;
        local_7c8.p = local_a20.p;
        local_7c8.jstride = local_a20.jstride;
        local_7c8.kstride = local_a20.kstride;
        local_7c8.nstride = local_a20.nstride;
        local_7c8.begin.z = local_a20.begin.z;
        local_7c8.end.z = local_a20.end.z;
        local_7c8.end.x = local_a20.end.x;
        local_7c8.end.y = local_a20.end.y;
        local_7c8.ncomp = local_a20.ncomp;
        local_b20.p = local_8b8.p;
        local_b20.jstride = local_8b8.jstride;
        local_b20.kstride = local_8b8.kstride;
        local_b20.nstride = local_8b8.nstride;
        local_b20.begin.z = local_8b8.begin.z;
        local_b20.begin.y = local_8b8.begin.y;
        local_b20.begin.x = local_8b8.begin.x;
        local_b20.end.z = local_8b8.end.z;
        local_b20.end.x = local_8b8.end.x;
        local_b20.end.y = local_8b8.end.y;
        local_b20.ncomp = local_8b8.ncomp;
        HydroUtils::ComputeDivergence
                  (&local_c9c,&advc_arr,(Array4<const_double> *)&result,&local_7c8,&local_b20,ncomp,
                   geom,-1.0,true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u
                  );
        local_c38._0_8_ = uVar13;
        if (0 < ncomp) {
          local_c38.x = (int)uVar14;
          lVar28 = (long)local_c9c.smallend.vect[0];
          local_c80 = advc_arr.p + (lVar28 - advc_arr.begin.x);
          local_9a0 = advc_arr.nstride * 8;
          local_970 = advc_arr.kstride * 8;
          local_978 = -(long)advc_arr.begin.z;
          local_c70 = advc_arr.jstride * 8;
          local_988 = lVar28 * 8 + (long)local_c38.x * -8 + result.smallend.vect._0_8_;
          local_980 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
          local_990 = -(long)iVar17;
          local_c38.y = SUB84(uVar14,4);
          lVar18 = (long)local_c38.y;
          local_bf0 = apz.p + (lVar28 - apz.begin.x);
          local_9a8 = apz.nstride * 8;
          iVar17 = (local_c9c.smallend.vect[2] - apz.begin.z) + 1;
          local_9c0 = CONCAT44(local_9c0._4_4_,iVar17);
          local_bf8 = apy.p + (lVar28 - apy.begin.x);
          local_9b0 = (double *)(apy.nstride * 8);
          local_9c8 = apx.p;
          local_be8 = apx.p + (lVar28 - apx.begin.x);
          in_stack_fffffffffffff2f0 = (Array4<const_double> *)(ulong)(uint)local_c9c.bigend.vect[0];
          in_stack_fffffffffffff2f8 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff2f8 >> 0x20),local_c9c.bigend.vect[1]);
          local_9d0 = apx.nstride;
          local_9b8 = (double *)(apx.nstride * 8);
          local_998 = apx.kstride * 8;
          local_cc0 = (Array4<const_double> *)0x0;
          do {
            if (local_c9c.smallend.vect[2] <= local_c9c.bigend.vect[2]) {
              local_c78 = (ulong)(uint)local_c9c.smallend.vect[2];
              iVar55 = iVar17;
              do {
                if (local_c9c.smallend.vect[1] <= local_c9c.bigend.vect[1]) {
                  lVar28 = (long)(int)(uint)local_c78;
                  lVar40 = (lVar28 - apy.begin.z) * apy.kstride * 8;
                  uVar44 = local_c9c.smallend.vect[1];
                  iVar25 = local_c9c.smallend.vect[1] - apy.begin.y;
                  do {
                    iVar25 = iVar25 + 1;
                    if (local_c9c.smallend.vect[0] <= local_c9c.bigend.vect[0]) {
                      lVar37 = (long)(int)uVar44;
                      lVar29 = (lVar37 - advc_arr.begin.y) * local_c70 +
                               (local_978 + lVar28) * local_970;
                      lVar43 = (lVar37 - apz.begin.y) * apz.jstride * 8;
                      iVar54 = local_c68[(long)local_cc0];
                      lVar33 = 0;
                      do {
                        if (iVar54 == 0) {
                          *(double *)((long)local_c80 + lVar33 * 8 + lVar29) =
                               ((*(double *)
                                  ((long)local_bf0 +
                                  lVar33 * 8 + lVar43 + (lVar28 - apz.begin.z) * apz.kstride * 8) +
                                 *(double *)
                                  ((long)local_bf0 +
                                  lVar33 * 8 + lVar43 + (long)iVar55 * apz.kstride * 8) +
                                *(double *)
                                 ((long)local_be8 +
                                 lVar33 * 8 +
                                 (lVar37 - apx.begin.y) * apx.jstride * 8 +
                                 (lVar28 - apx.begin.z) * local_998) +
                                apx.p[(long)local_cc0 * apx.nstride +
                                      (int)((uint)local_c78 - apx.begin.z) * apx.kstride +
                                      (int)(uVar44 - apx.begin.y) * apx.jstride +
                                      (long)((int)lVar33 +
                                            (local_c9c.smallend.vect[0] - apx.begin.x) + 1)] +
                                *(double *)
                                 ((long)local_bf8 +
                                 lVar33 * 8 + (lVar37 - apy.begin.y) * apy.jstride * 8 + lVar40) +
                                *(double *)
                                 ((long)local_bf8 +
                                 lVar33 * 8 + (long)iVar25 * apy.jstride * 8 + lVar40)) / 6.0) *
                               *(double *)
                                ((lVar37 - lVar18) *
                                 CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                 (local_990 + lVar28) * local_980 + local_988 + lVar33 * 8) +
                               *(double *)((long)local_c80 + lVar33 * 8 + lVar29);
                        }
                        lVar33 = lVar33 + 1;
                      } while ((local_c9c.bigend.vect[0] - local_c9c.smallend.vect[0]) + 1 !=
                               (int)lVar33);
                    }
                    bVar46 = uVar44 != local_c9c.bigend.vect[1];
                    uVar44 = uVar44 + 1;
                  } while (bVar46);
                }
                uVar44 = (uint)local_c78 + 1;
                iVar55 = iVar55 + 1;
                bVar46 = (uint)local_c78 != local_c9c.bigend.vect[2];
                local_c78 = (ulong)uVar44;
              } while (bVar46);
            }
            local_cc0 = (Array4<const_double> *)((long)&local_cc0->p + 1);
            local_c80 = local_c80 + advc_arr.nstride;
            local_bf0 = local_bf0 + apz.nstride;
            local_bf8 = local_bf8 + apy.nstride;
            local_be8 = local_be8 + apx.nstride;
          } while (local_cc0 != pAVar22);
        }
      }
      else {
        amrex::MultiCutFab::const_array(&local_7c8,local_528,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_b20,local_520,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_4d0,local_518,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_510,local_540,(MFIter *)&u);
        amrex::MultiCutFab::const_array((Array4<const_double> *)local_6a8,local_538,(MFIter *)&u);
        amrex::MultiCutFab::const_array((Array4<const_double> *)local_878,local_530,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_608,pMVar21,(MFIter *)&u);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&eli_1,this,(MFIter *)&u);
        amrex::FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_378,pFVar20,(MFIter *)&u);
        iVar17 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
        iVar17 = (iVar17 == 0) + 4;
        result_1.smallend.vect[0] = local_c9c.smallend.vect[0] - iVar17;
        result_1.smallend.vect[1] = local_c9c.smallend.vect[1] - iVar17;
        result_1.smallend.vect[2] = local_c9c.smallend.vect[2] - iVar17;
        result_1.bigend.vect[0] = local_c9c.bigend.vect[0] + iVar17;
        result_1.bigend.vect[1] = iVar17 + local_c9c.bigend.vect[1];
        result_1.bigend.vect[2] = iVar17 + local_c9c.bigend.vect[2];
        amrex::FArrayBox::FArrayBox
                  ((FArrayBox *)&result,&result_1,local_924,true,false,(Arena *)0x0);
        pAVar24 = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
        if (pAVar24 == (Arena *)0x0) {
          pAVar24 = amrex::The_Arena();
        }
        amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,pAVar24);
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result_1,&state->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u,local_c5c);
          in_stack_fffffffffffff250 = &local_5c0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff250,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
          ;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_648,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
          local_3a8 = (undefined1  [16])0x0;
          local_3b8 = (undefined1  [16])0x0;
          local_398.x = 1;
          local_398.y = 1;
          local_398.z = 1;
          local_38c = (undefined1  [16])0x0;
          in_stack_fffffffffffff258 = &local_648;
          in_stack_fffffffffffff248 = &fcz;
          in_stack_fffffffffffff240 = &fcy;
          in_stack_fffffffffffff238 = &fcx;
          in_stack_fffffffffffff230 = 0x3e8ee9;
          in_stack_fffffffffffff260 = geom;
          in_stack_fffffffffffff268 = h_bc;
          in_stack_fffffffffffff270 = d_bc;
          in_stack_fffffffffffff278 = local_c68;
          ComputeEdgeState(&local_c9c,ncomp,(Array4<const_double> *)&result_1,(Array4<double> *)&apx
                           ,(Array4<double> *)&apy,(Array4<double> *)&apz,in_stack_fffffffffffff238,
                           in_stack_fffffffffffff240,in_stack_fffffffffffff248,
                           in_stack_fffffffffffff250,in_stack_fffffffffffff258,geom,local_9e0,h_bc,
                           d_bc,local_c68,
                           (Real *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&local_378,
                           &local_510,(Array4<const_double> *)local_6a8,
                           (Array4<const_double> *)local_878,(Array4<const_double> *)&eli_1,
                           &local_7c8,&local_b20,&local_4d0,&local_608,is_velocity,
                           (Array4<const_double> *)local_3b8);
        }
        result_1.smallend.vect[0] = (int)apx.p;
        result_1.smallend.vect[1] = (int)((ulong)apx.p >> 0x20);
        result_1.smallend.vect[2] = (int)apx.jstride;
        result_1.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
        result_1.bigend.vect[1] = (int)apx.kstride;
        result_1.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
        result_1.btype.itype = (uint)apx.nstride;
        local_5c0.p = apy.p;
        local_5c0.jstride = apy.jstride;
        local_5c0.kstride = apy.kstride;
        local_5c0.nstride = apy.nstride;
        local_5c0.begin.z = apy.begin.z;
        local_5c0.end.z = apy.end.z;
        local_5c0.end.x = apy.end.x;
        local_5c0.end.y = apy.end.y;
        local_5c0.ncomp = apy.ncomp;
        local_648.p = apz.p;
        local_648.jstride = apz.jstride;
        local_648.kstride = apz.kstride;
        local_648.nstride = apz.nstride;
        local_648.begin.z = apz.begin.z;
        local_648.end.z = apz.end.z;
        local_648.end.x = apz.end.x;
        local_648.end.y = apz.end.y;
        local_648.ncomp = apz.ncomp;
        in_stack_fffffffffffff2b0 = (Array4<const_double> *)local_6a8;
        in_stack_fffffffffffff2a8 = &local_510;
        in_stack_fffffffffffff2a0 = &local_648;
        in_stack_fffffffffffff288 = &fcz;
        in_stack_fffffffffffff280 = 0x3e90d4;
        in_stack_fffffffffffff290 = (Array4<double> *)&result_1;
        in_stack_fffffffffffff298 = &local_5c0;
        HydroUtils::EB_ComputeFluxes
                  (&local_c9c,(Array4<double> *)&local_968,&local_a20,&local_8b8,&fcx,&fcy,
                   in_stack_fffffffffffff288,(Array4<const_double> *)&result_1,&local_5c0,
                   in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2b0,
                   (Array4<const_double> *)local_878,geom,ncomp,&local_378,true);
        iVar17 = local_968.begin.z;
        uVar13 = local_968.begin._0_8_;
        result_1.smallend.vect[0] = (int)local_968.p;
        result_1.smallend.vect[1] = (int)((ulong)local_968.p >> 0x20);
        result_1.smallend.vect[2] = (int)local_968.jstride;
        result_1.bigend.vect[0] = (int)((ulong)local_968.jstride >> 0x20);
        result_1.bigend.vect[1] = (int)local_968.kstride;
        result_1.bigend.vect[2] = (int)((ulong)local_968.kstride >> 0x20);
        result_1.btype.itype = (uint)local_968.nstride;
        local_5c0.p = local_a20.p;
        local_5c0.jstride = local_a20.jstride;
        local_5c0.kstride = local_a20.kstride;
        local_5c0.nstride = local_a20.nstride;
        local_5c0.begin.z = local_a20.begin.z;
        local_5c0.end.z = local_a20.end.z;
        local_5c0.end.x = local_a20.end.x;
        local_5c0.end.y = local_a20.end.y;
        local_5c0.ncomp = local_a20.ncomp;
        local_648.p = local_8b8.p;
        local_648.jstride = local_8b8.jstride;
        local_648.kstride = local_8b8.kstride;
        local_648.nstride = local_8b8.nstride;
        local_648.begin.z = local_8b8.begin.z;
        local_648.end.z = local_8b8.end.z;
        local_648.end.x = local_8b8.end.x;
        local_648.end.y = local_8b8.end.y;
        local_648.ncomp = local_8b8.ncomp;
        HydroUtils::EB_ComputeDivergence
                  (&local_c9c,&advc_arr,(Array4<const_double> *)&result_1,&local_5c0,&local_648,
                   (Array4<const_double> *)&eli_1,ncomp,geom,-1.0,true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result_1,&divu_mac.super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&u);
        if (0 < ncomp) {
          local_818 = (int)uVar13;
          lVar28 = (long)local_c9c.smallend.vect[0];
          lVar40 = lVar28 * 8;
          local_b90 = advc_arr.p + (lVar28 - advc_arr.begin.x);
          local_998 = advc_arr.kstride * 8;
          local_9c0 = -(long)advc_arr.begin.z;
          local_9a0 = lVar40 + (long)local_818 * -8 +
                      CONCAT44(result_1.smallend.vect[1],result_1.smallend.vect[0]);
          local_9c8 = (double *)(CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 8);
          local_9d0 = -(long)iVar17;
          iStack_814 = SUB84(uVar13,4);
          local_9a8 = lVar40 + (long)local_858 * -8 + CONCAT44(local_878._4_4_,local_878._0_4_);
          lVar18 = CONCAT44(local_878._20_4_,local_878._16_4_) * 8;
          local_c78 = CONCAT44(local_878._12_4_,local_878._8_4_) * 8;
          local_b40 = apz.p + (lVar28 - apz.begin.x);
          local_9b0 = (double *)(local_6a8._0_8_ + (lVar28 - local_688.x) * 8);
          local_c80 = (double *)(local_6a8._8_8_ * 8);
          local_b48 = apy.p + (lVar28 - apy.begin.x);
          local_9b8 = local_510.p + (lVar28 - local_510.begin.x);
          local_970 = -(long)local_510.begin.y;
          local_b50 = apx.p + (lVar28 - apx.begin.x);
          local_978 = apx.jstride * 8;
          local_980 = -(long)apx.begin.y;
          local_988 = (long)eli_1.m_pa.
                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            .
                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish * 8;
          local_990 = -(long)local_55c;
          local_920 = local_c9c.smallend.vect[2] + 1;
          local_91c = local_c9c.smallend.vect[1] + 1;
          local_cb8 = (Array4<const_double> *)0x0;
          do {
            uVar44 = local_c9c.smallend.vect[2];
            iVar17 = local_920;
            if (local_c9c.smallend.vect[2] <= local_c9c.bigend.vect[2]) {
              do {
                if (local_c9c.smallend.vect[1] <= local_c9c.bigend.vect[1]) {
                  lVar29 = (long)(int)uVar44;
                  lVar28 = (lVar29 - local_688.z) * local_6a8._16_8_ * 8;
                  lVar37 = (lVar29 - apy.begin.z) * apy.kstride * 8;
                  local_c70 = (-(long)local_850 + (long)iVar17) * lVar18 + local_9a8;
                  in_stack_fffffffffffff2f0 =
                       (Array4<const_double> *)(ulong)(uint)local_c9c.smallend.vect[1];
                  iVar55 = local_91c;
                  do {
                    uVar39 = (uint)in_stack_fffffffffffff2f0;
                    if (local_c9c.smallend.vect[0] <= local_c9c.bigend.vect[0]) {
                      lVar38 = (long)(int)uVar39;
                      lVar43 = (lVar38 - advc_arr.begin.y) * advc_arr.jstride * 8 +
                               (local_9c0 + lVar29) * local_998;
                      lVar31 = (lVar38 - local_854) * local_c78;
                      in_stack_fffffffffffff2f8 = (Array4<const_double> *)(local_c70 + lVar31);
                      lVar35 = (lVar38 - apz.begin.y) * apz.jstride * 8;
                      lVar33 = (local_970 + lVar38) * local_510.jstride * 8 +
                               (lVar29 - local_510.begin.z) * local_510.kstride * 8;
                      lVar10 = (local_980 + lVar38) * local_978 +
                               (lVar29 - apx.begin.z) * apx.kstride * 8;
                      iVar25 = local_c68[(long)local_cb8];
                      lVar45 = 0;
                      do {
                        if ((iVar25 == 0) &&
                           ((dVar2 = *(double *)
                                      ((long)eli_1.m_pa.
                                             super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                             .
                                             super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar45 * 8 +
                                      (lVar38 + local_990) * local_988 +
                                      (lVar29 - local_558) *
                                      (long)eli_1.m_pa.
                                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                            .
                                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage * 8 +
                                      lVar40 + (long)local_560 * -8), dVar2 != 0.0 || (NAN(dVar2))))
                           ) {
                          dVar2 = *(double *)((long)local_9b8 + lVar45 * 8 + lVar33);
                          dVar3 = *(double *)((long)local_9b8 + lVar45 * 8 + lVar33 + 8);
                          dVar4 = *(double *)
                                   ((long)local_9b0 +
                                   lVar45 * 8 +
                                   (-(long)local_688.y + lVar38) * (long)local_c80 + lVar28);
                          dVar5 = *(double *)
                                   ((long)local_9b0 +
                                   lVar45 * 8 +
                                   (-(long)local_688.y + (long)iVar55) * (long)local_c80 + lVar28);
                          dVar6 = *(double *)
                                   (lVar31 + (-(long)local_850 + lVar29) * lVar18 + local_9a8 +
                                   lVar45 * 8);
                          *(double *)((long)local_b90 + lVar45 * 8 + lVar43) =
                               ((*(double *)
                                  ((long)local_b40 +
                                  lVar45 * 8 +
                                  lVar35 + (-(long)apz.begin.z + lVar29) * apz.kstride * 8) * dVar6
                                 + *(double *)
                                    ((long)local_b40 +
                                    lVar45 * 8 +
                                    lVar35 + ((long)iVar17 + -(long)apz.begin.z) * apz.kstride * 8)
                                   * (double)(&in_stack_fffffffffffff2f8->p)[lVar45] +
                                *(double *)
                                 ((long)local_b48 +
                                 lVar45 * 8 +
                                 ((long)iVar55 + -(long)apy.begin.y) * apy.jstride * 8 + lVar37) *
                                dVar5 + *(double *)
                                         ((long)local_b48 +
                                         lVar45 * 8 +
                                         (-(long)apy.begin.y + lVar38) * apy.jstride * 8 + lVar37) *
                                        dVar4 + *(double *)((long)local_b50 + lVar45 * 8 + lVar10) *
                                                dVar2 + *(double *)
                                                         ((long)local_b50 + lVar45 * 8 + lVar10 + 8)
                                                        * dVar3) /
                               (dVar2 + dVar3 + dVar4 + dVar5 + dVar6 +
                               (double)(&in_stack_fffffffffffff2f8->p)[lVar45])) *
                               *(double *)
                                ((lVar38 - iStack_814) *
                                 CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 8 +
                                 (local_9d0 + lVar29) * (long)local_9c8 + local_9a0 + lVar45 * 8) +
                               *(double *)((long)local_b90 + lVar45 * 8 + lVar43);
                        }
                        lVar45 = lVar45 + 1;
                      } while ((local_c9c.bigend.vect[0] - local_c9c.smallend.vect[0]) + 1 !=
                               (int)lVar45);
                    }
                    in_stack_fffffffffffff2f0 = (Array4<const_double> *)(ulong)(uVar39 + 1);
                    iVar55 = iVar55 + 1;
                  } while (uVar39 != local_c9c.bigend.vect[1]);
                }
                bVar46 = uVar44 != local_c9c.bigend.vect[2];
                uVar44 = uVar44 + 1;
                iVar17 = iVar17 + 1;
              } while (bVar46);
            }
            local_cb8 = (Array4<const_double> *)((long)&local_cb8->p + 1);
            local_b90 = local_b90 + advc_arr.nstride;
            local_b40 = local_b40 + apz.nstride;
            local_b48 = local_b48 + apy.nstride;
            local_b50 = local_b50 + apx.nstride;
          } while (local_cb8 != pAVar22);
        }
        amrex::Gpu::Elixir::~Elixir(&eli);
        result.smallend.vect._0_8_ = &PTR__BaseFab_00837b90;
        amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
      }
      amrex::MFIter::operator++((MFIter *)&u);
    } while (local_8f8[0] < local_8f8[2]);
  }
  pEVar19 = local_9d8;
  amrex::MFIter::~MFIter((MFIter *)&u);
  PVar56 = amrex::Geometry::periodicity(geom);
  u._M_elems[0]._0_1_ = (undefined1)PVar56.period.vect[0];
  u._M_elems[0]._1_7_ = PVar56.period.vect._1_7_;
  u._M_elems[1]._0_4_ = PVar56.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&u,false);
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  if (local_8f8[0] < local_8f8[2]) {
    do {
      amrex::MFIter::tilebox((Box *)local_878,(MFIter *)&u);
      pFVar20 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((pEVar19->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      piVar26 = local_8f8;
      if (local_8d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar26 = (local_8d8->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_8f8[0];
      }
      pEVar9 = (pFVar20->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar26];
      local_968.p = (pEVar9->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_968.ncomp = (pEVar9->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar9->super_BaseFab<amrex::EBCellFlag>).domain;
      local_968.begin.z = (pEVar9->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_968.begin.x = (pBVar1->smallend).vect[0];
      local_968.begin.y = (pBVar1->smallend).vect[1];
      lVar18 = (long)(pEVar9->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar28 = (long)(pEVar9->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar40 = (long)(pEVar9->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_968.jstride = (lVar28 - (pBVar1->smallend).vect[0]) + 1;
      local_968.kstride =
           (lVar18 - (pEVar9->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_968.jstride;
      local_968.nstride = (lVar40 - local_968.begin.z) * local_968.kstride;
      local_968.end._0_8_ = lVar28 + 1U & 0xffffffff | lVar18 << 0x20;
      local_968.end.z = (int)lVar40;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_a20,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,aofs_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_8b8,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      FVar15 = amrex::EBCellFlagFab::getType(pEVar9,(Box *)local_878);
      if (FVar15 != covered) {
        result.btype.itype = local_878._24_4_;
        result.smallend.vect[2] = local_878._8_4_ - 4;
        result.bigend.vect[0] = local_878._12_4_ + 4;
        result.smallend.vect[1] = local_878._4_4_ + -4;
        result.smallend.vect[0] = local_878._0_4_ + -4;
        result.bigend.vect[1] = local_878._16_4_ + 4;
        result.bigend.vect[2] = local_878._20_4_ + 4;
        FVar15 = amrex::EBCellFlagFab::getType(pEVar9,&result);
        pEVar19 = local_9d8;
        if (FVar15 == regular) {
          if (0 < ncomp) {
            local_c68 = (int *)CONCAT44(local_c68._4_4_,local_878._8_4_);
            lVar18 = (long)(int)local_878._4_4_;
            in_stack_fffffffffffff2f8 =
                 (Array4<const_double> *)
                 ((lVar18 - local_a20.begin.y) * local_a20.jstride * 8 +
                  (long)(int)local_878._0_4_ * 8 + (long)local_a20.begin.x * -8 + (long)local_a20.p)
            ;
            lVar28 = (lVar18 - local_8b8.begin.y) * local_8b8.jstride * 8 +
                     (long)(int)local_878._0_4_ * 8 + (long)local_8b8.begin.x * -8 +
                     (long)local_8b8.p;
            in_stack_fffffffffffff2f0 = (Array4<const_double> *)-(long)local_8b8.begin.z;
            uVar42 = 0;
            do {
              uVar44 = local_878._8_4_;
              if ((int)local_878._8_4_ <= (int)local_878._20_4_) {
                do {
                  if ((int)local_878._4_4_ <= (int)local_878._16_4_) {
                    ppdVar30 = (double **)
                               ((long)&in_stack_fffffffffffff2f8->p +
                               ((long)(int)uVar44 - (long)local_a20.begin.z) * local_a20.kstride * 8
                               );
                    lVar29 = (long)((long)&in_stack_fffffffffffff2f0->p + (long)(int)uVar44) *
                             local_8b8.kstride * 8 + lVar28;
                    lVar40 = lVar18;
                    do {
                      if ((int)local_878._0_4_ <= (int)local_878._12_4_) {
                        lVar37 = 0;
                        do {
                          ppdVar30[lVar37] =
                               (double *)(*(ulong *)(lVar29 + lVar37 * 8) ^ 0x8000000000000000);
                          lVar37 = lVar37 + 1;
                        } while ((local_878._12_4_ - local_878._0_4_) + 1 != (int)lVar37);
                      }
                      lVar40 = lVar40 + 1;
                      ppdVar30 = ppdVar30 + local_a20.jstride;
                      lVar29 = lVar29 + local_8b8.jstride * 8;
                    } while (local_878._16_4_ + 1 != (int)lVar40);
                  }
                  bVar46 = uVar44 != local_878._20_4_;
                  uVar44 = uVar44 + 1;
                } while (bVar46);
              }
              uVar42 = uVar42 + 1;
              in_stack_fffffffffffff2f8 =
                   (Array4<const_double> *)(&in_stack_fffffffffffff2f8->p + local_a20.nstride);
              lVar28 = lVar28 + local_8b8.nstride * 8;
            } while (uVar42 != (uint)ncomp);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac
                    ((local_9d8->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u);
          amrex::EBDataCollection::getAreaFrac
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getAreaFrac
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((pEVar19->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                     (MFIter *)&u);
          pMVar21 = amrex::EBDataCollection::getCentroid
                              ((pEVar19->m_ebdc).
                               super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          amrex::MultiCutFab::const_array((Array4<const_double> *)&advc_arr,pMVar21,(MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_7c8,this,(MFIter *)&u);
          local_608.p = (double *)CONCAT44(local_878._4_4_,local_878._0_4_);
          local_608.nstride._0_4_ = local_878._24_4_;
          local_608.kstride._4_4_ = local_878._20_4_;
          local_608.kstride._0_4_ = local_878._16_4_;
          local_608.jstride._0_4_ = local_878._8_4_;
          local_608.jstride._4_4_ = local_878._12_4_;
          iVar17 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          if (iVar17 == 0) {
            iVar17 = (int)local_608.p + -3;
            iVar55 = 3;
            iVar25 = -3;
LAB_003eb626:
            local_608.p = (double *)CONCAT44(local_608.p._4_4_ + iVar25,iVar17);
            local_608.jstride._0_4_ = (uint)local_608.jstride + iVar25;
            local_608.jstride._4_4_ = local_608.jstride._4_4_ + iVar55;
            local_608.kstride._0_4_ = (int)local_608.kstride + iVar55;
            local_608.kstride._4_4_ = local_608.kstride._4_4_ + iVar55;
          }
          else {
            iVar17 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
            if (iVar17 == 0) {
              iVar17 = (int)local_608.p + -2;
              iVar55 = 2;
              iVar25 = -2;
              goto LAB_003eb626;
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)&result,(Box *)&local_608,ncomp,true,false,(Arena *)0x0);
          pAVar24 = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
          if (pAVar24 == (Arena *)0x0) {
            pAVar24 = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir(&eli_1,(void *)0x0,pAVar24);
          local_b20.p = (double *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
          local_b20.begin.y = local_c3c;
          local_b20.begin.x = result.btype.itype;
          local_b20.jstride = ((long)local_c38.y - (long)(int)result.btype.itype) + 1;
          local_b20.kstride = (((long)local_c38.z + 1) - (long)local_c3c) * local_b20.jstride;
          local_b20.nstride = (((long)(int)local_c2c + 1) - (long)local_c38.x) * local_b20.kstride;
          local_b20.end._0_8_ = (long)local_c38.y + 1U & 0xffffffff | (long)local_c38.z + 1 << 0x20;
          local_b20.begin.z = local_c38.x;
          local_b20.end.z = (int)((long)(int)local_c2c + 1);
          local_b20.ncomp = local_c24;
          iVar17 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          auVar12 = _DAT_0077bb40;
          auVar11 = _DAT_0077bb30;
          if ((iVar17 == 0) && (local_b20.begin.z < local_b20.end.z)) {
            uVar44 = ~local_b20.begin.x + local_b20.end.x;
            auVar48._4_4_ = 0;
            auVar48._0_4_ = uVar44;
            auVar48._8_4_ = uVar44;
            auVar48._12_4_ = 0;
            auVar48 = auVar48 ^ _DAT_0077bb40;
            iVar17 = local_b20.begin.z;
            do {
              if (local_b20.begin.y < local_b20.end.y) {
                lVar18 = (long)local_b20.p +
                         ((long)iVar17 - (long)local_b20.begin.z) * local_b20.kstride * 8 + 8;
                iVar55 = local_b20.begin.y;
                do {
                  if (local_b20.begin.x < local_b20.end.x) {
                    uVar42 = 0;
                    do {
                      auVar51._8_4_ = (int)uVar42;
                      auVar51._0_8_ = uVar42;
                      auVar51._12_4_ = (int)(uVar42 >> 0x20);
                      auVar52 = (auVar51 | auVar11) ^ auVar12;
                      bVar46 = auVar48._0_4_ < auVar52._0_4_;
                      iVar25 = auVar48._4_4_;
                      iVar54 = auVar52._4_4_;
                      if ((bool)(~(iVar25 < iVar54 || iVar54 == iVar25 && bVar46) & 1)) {
                        *(undefined8 *)(lVar18 + (uVar42 - 1) * 8) = 0x3ff0000000000000;
                      }
                      if (iVar25 >= iVar54 && (iVar54 != iVar25 || !bVar46)) {
                        *(undefined8 *)(lVar18 + uVar42 * 8) = 0x3ff0000000000000;
                      }
                      uVar42 = uVar42 + 2;
                    } while (((ulong)uVar44 + 2 & 0x1fffffffe) != uVar42);
                  }
                  iVar55 = iVar55 + 1;
                  lVar18 = lVar18 + local_b20.jstride * 8;
                } while (local_b20.end.y != iVar55);
              }
              bVar46 = iVar17 != local_b20.end.z + -1;
              iVar17 = iVar17 + 1;
            } while (bVar46);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_4d0,&advc.super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_510,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,local_c5c);
          local_668[0] = local_658;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_668,*(long *)redistribution_type._M_dataplus._M_p,
                     *(long *)(redistribution_type._M_dataplus._M_p + 8) +
                     *(long *)redistribution_type._M_dataplus._M_p);
          local_6a8._16_16_ = (undefined1  [16])0x0;
          local_6a8._0_16_ = (undefined1  [16])0x0;
          local_688.x = 1;
          local_688.y = 1;
          local_688.z = 1;
          local_67c = (undefined1  [16])0x0;
          redistribution_type_00._M_string_length._0_4_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_668;
          redistribution_type_00._M_string_length._4_4_ = 0;
          redistribution_type_00.field_2._M_local_buf[0] = (char)local_6a8;
          redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)local_6a8 >> 8)
          ;
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff2e8;
          Redistribution::Apply
                    ((Box *)local_878,ncomp,&local_a20,(Array4<double> *)&local_4d0,&local_510,
                     (Array4<double> *)&local_b20,&local_968,&apx,&apy,&apz,&local_7c8,&fcx,&fcy,
                     &fcz,(Array4<const_double> *)&advc_arr,d_bc,geom,local_9e0,
                     redistribution_type_00,(int)in_stack_fffffffffffff2f0,0.5,
                     in_stack_fffffffffffff2f8);
          if (local_668[0] != local_658) {
            operator_delete(local_668[0],local_658[0] + 1);
          }
          auVar12 = _DAT_0077bb40;
          auVar11 = _DAT_0077bb30;
          if (0 < ncomp) {
            in_stack_fffffffffffff2f0 = (Array4<const_double> *)(ulong)(uint)local_878._8_4_;
            uVar44 = local_878._12_4_ - local_878._0_4_;
            auVar49._4_4_ = 0;
            auVar49._0_4_ = uVar44;
            auVar49._8_4_ = uVar44;
            auVar49._12_4_ = 0;
            lVar18 = (long)local_a20.p +
                     ((long)(int)local_878._4_4_ - (long)local_a20.begin.y) * local_a20.jstride * 8
                     + (long)(int)local_878._0_4_ * 8 + (long)local_a20.begin.x * -8 + 8;
            in_stack_fffffffffffff2f8 = (Array4<const_double> *)(local_a20.kstride * 8);
            auVar49 = auVar49 ^ _DAT_0077bb40;
            uVar42 = 0;
            do {
              uVar39 = local_878._8_4_;
              if ((int)local_878._8_4_ <= (int)local_878._20_4_) {
                do {
                  if ((int)local_878._4_4_ <= (int)local_878._16_4_) {
                    lVar40 = ((long)(int)uVar39 - (long)local_a20.begin.z) *
                             (long)in_stack_fffffffffffff2f8 + lVar18;
                    lVar28 = (long)(int)local_878._4_4_;
                    do {
                      if ((int)local_878._0_4_ <= (int)local_878._12_4_) {
                        uVar27 = 0;
                        do {
                          auVar53._8_4_ = (int)uVar27;
                          auVar53._0_8_ = uVar27;
                          auVar53._12_4_ = (int)(uVar27 >> 0x20);
                          auVar52 = (auVar53 | auVar11) ^ auVar12;
                          bVar46 = auVar49._0_4_ < auVar52._0_4_;
                          iVar17 = auVar49._4_4_;
                          iVar55 = auVar52._4_4_;
                          if ((bool)(~(iVar17 < iVar55 || iVar55 == iVar17 && bVar46) & 1)) {
                            *(ulong *)(lVar40 + -8 + uVar27 * 8) =
                                 *(ulong *)(lVar40 + -8 + uVar27 * 8) ^ 0x8000000000000000;
                          }
                          if (iVar17 >= iVar55 && (iVar55 != iVar17 || !bVar46)) {
                            *(ulong *)(lVar40 + uVar27 * 8) =
                                 *(ulong *)(lVar40 + uVar27 * 8) ^ 0x8000000000000000;
                          }
                          uVar27 = uVar27 + 2;
                        } while (((ulong)uVar44 + 2 & 0x1fffffffe) != uVar27);
                      }
                      lVar28 = lVar28 + 1;
                      lVar40 = lVar40 + local_a20.jstride * 8;
                    } while (local_878._16_4_ + 1 != (int)lVar28);
                  }
                  bVar46 = uVar39 != local_878._20_4_;
                  uVar39 = uVar39 + 1;
                } while (bVar46);
              }
              uVar42 = uVar42 + 1;
              lVar18 = lVar18 + local_a20.nstride * 8;
            } while (uVar42 != (uint)ncomp);
          }
          amrex::Gpu::Elixir::~Elixir(&eli_1);
          result.smallend.vect._0_8_ = &PTR__BaseFab_00837b90;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
        }
      }
      amrex::MFIter::operator++((MFIter *)&u);
      pEVar19 = local_9d8;
    } while (local_8f8[0] < local_8f8[2]);
  }
  amrex::MFIter::~MFIter((MFIter *)&u);
  amrex::MultiFab::~MultiFab(&divu_mac);
  amrex::MultiFab::~MultiFab(&advc);
  if (iconserv_d.m_data != (pointer)0x0) {
    operator_delete(iconserv_d.m_data,iconserv_d.m_capacity << 2);
  }
  return;
}

Assistant:

void
EBGodunov::ComputeAofs ( MultiFab& aofs, const int aofs_comp, const int ncomp,
                         MultiFab const& state, const int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         const int  edge_comp,
                         const bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         MultiFab const& fq,
                         const int fq_comp,
                         MultiFab const& divu,
                         Vector<BCRec> const& h_bc,
                         BCRec const* d_bc,
                         Geometry const& geom,
                         Vector<int>& iconserv,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type)
{
    BL_PROFILE("EBGodunov::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());

    auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = ebfact.getMultiEBCellFlagFab();
    auto const& fcent = ebfact.getFaceCent();
    auto const& ccent = ebfact.getCentroid();
    auto const& vfrac = ebfact.getVolFrac();
    auto const& areafrac = ebfact.getAreaFrac();

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfact);
    advc.setVal(0.);

    // if we need convective form, we must also compute
    // div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0, MFInfo(), ebfact);
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);

            if (!ebfact.isAllRegular())
                amrex::EB_computeDivergence(divu_mac,u,geom,true);
            else
                amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

    // Compute -div instead of computing div -- this is just for consistency
    // with the way we HAVE to do it for EB (because redistribution operates on
    // -div rather than div
    Real mult = -1.0;

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    // A regular box uses 3 ghost cells:
    // We predict the state on the edge based box; that calls slopes on
    // i & i-1; slopes then looks at (i-1)-2 for 4th order slopes
    // => test on bx grow 3
        bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

    Array4<Real> advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) == FabType::covered)
        {
        AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
              const Box& ybx = mfi.nodaltilebox(1);,
              const Box& zbx = mfi.nodaltilebox(2); );

            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
        if (regular)   // Plain Godunov
        {
            if (!known_edgestate)
            {
                Godunov::ComputeEdgeState( bx, ncomp,
                                           state.array(mfi,state_comp),
                                           AMREX_D_DECL( xed, yed, zed ),
                                           AMREX_D_DECL( u, v, w ),
                                           divu.array(mfi),
                                           fq.array(mfi,fq_comp),
                                           geom, dt, d_bc,
                                           iconserv_ptr,
                                           false,
                                           false,
                                           is_velocity );
            }

            HydroUtils::ComputeFluxes( bx,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       AMREX_D_DECL( u, v, w ),
                                       AMREX_D_DECL( xed, yed, zed ),
                                       geom, ncomp, fluxes_are_area_weighted );

            HydroUtils::ComputeDivergence( bx, advc_arr,
                                           AMREX_D_DECL( fx, fy, fz ),
                                           ncomp, geom,
                                           mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
                    Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                           + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                    q *= 0.25;
#else
                    q += zed(i,j,k,n) + zed(i,j,k+1,n);
                    q /= 6.0;
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
                }
            });

        }
        else     // EB Godunov
        {
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

            AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                         Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                         Array4<Real const> const& apz = areafrac[2]->const_array(mfi););

            Array4<Real const> const& ccent_arr = ccent.const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);
            auto const& flags_arr  = flags.const_array(mfi);

        //FIXME - compare to HydroUtils which hard codes 4 ghost cells for all
            int ngrow = 4;

            if (redistribution_type=="StateRedist")
                ++ngrow;

            FArrayBox tmpfab(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab.elixir();


            if (!known_edgestate)
            {
                EBGodunov::ComputeEdgeState( bx, ncomp,
                                             state.array(mfi,state_comp),
                                             AMREX_D_DECL( xed, yed, zed ),
                                             AMREX_D_DECL( u, v, w ),
                                             divu.array(mfi),
                                             fq.array(mfi,fq_comp),
                                             geom, dt, h_bc, d_bc,
                                             iconserv_ptr,
                                             tmpfab.dataPtr(),
                                             flags_arr,
                                             AMREX_D_DECL( apx, apy, apz ),
                                             vfrac_arr,
                                             AMREX_D_DECL( fcx, fcy, fcz ),
                                             ccent_arr,
                                             is_velocity,
                                             Array4<Real const>{} );
            }

            HydroUtils::EB_ComputeFluxes( bx,
                                          AMREX_D_DECL( fx, fy, fz ),
                                          AMREX_D_DECL( u, v, w ),
                                          AMREX_D_DECL( xed, yed, zed ),
                                          AMREX_D_DECL( apx, apy, apz ),
                                          geom, ncomp, flags_arr, fluxes_are_area_weighted );

            // div at ncomp*3 to make space for the 3 redistribute temporaries
            HydroUtils::EB_ComputeDivergence( bx,
                                              advc_arr,
                                              AMREX_D_DECL( fx, fy, fz ),
                                              vfrac_arr, ncomp, geom,
                                              mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
          if ( vfrac_arr(i,j,k) != 0 )
                  {
                    Real q = xed(i,j,k,n)*apx(i,j,k) + xed(i+1,j,k,n)*apx(i+1,j,k)
                           + yed(i,j,k,n)*apy(i,j,k) + yed(i,j+1,k,n)*apy(i,j+1,k);
#if (AMREX_SPACEDIM == 2)
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k));
#else
                    q += zed(i,j,k,n)*apz(i,j,k) + zed(i,j,k+1,n)*apz(i,j,k+1);
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k)+apz(i,j,k)+apz(i,j,k+1));
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
          }
                 }
            });
      }
    }
    }

    advc.FillBoundary(geom.periodicity());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);
    auto const& advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfact.getCentroid().const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
            Array4<Real> scratch = tmpfab.array(0);
            if (redistribution_type == "FluxRedist")
            {
                amrex::ParallelFor(Box(scratch),
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                                   AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because for EB we computed -div
            amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  -advc_arr(i,j,k,n); });
      }
    }
    }
}